

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

void google::protobuf::compiler::ruby::GenerateField(FieldDescriptor *field,Printer *printer)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  uint uVar3;
  CppType CVar4;
  string *psVar5;
  Descriptor *pDVar6;
  EnumDescriptor *pEVar7;
  int32 value;
  int32 value_00;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_68;
  string local_48;
  FieldDescriptor *local_28;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  Printer *printer_local;
  FieldDescriptor *field_local;
  
  key_field = (FieldDescriptor *)printer;
  printer_local = (Printer *)field;
  bVar2 = FieldDescriptor::is_map(field);
  pFVar1 = key_field;
  if (bVar2) {
    pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)printer_local);
    value_field = Descriptor::FindFieldByNumber(pDVar6,1);
    pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)printer_local);
    local_28 = Descriptor::FindFieldByNumber(pDVar6,2);
    pFVar1 = key_field;
    psVar5 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)printer_local);
    TypeName_abi_cxx11_(&local_48,(ruby *)value_field,field_01);
    TypeName_abi_cxx11_(&local_68,(ruby *)local_28,field_02);
    uVar3 = FieldDescriptor::number((FieldDescriptor *)printer_local);
    IntToString_abi_cxx11_(&local_98,(ruby *)(ulong)uVar3,value);
    io::Printer::Print((Printer *)pFVar1,"map :$name$, :$key_type$, :$value_type$, $number$","name",
                       psVar5,"key_type",&local_48,"value_type",&local_68,"number",&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    CVar4 = FieldDescriptor::cpp_type(local_28);
    pFVar1 = key_field;
    if (CVar4 == CPPTYPE_MESSAGE) {
      pDVar6 = FieldDescriptor::message_type(local_28);
      psVar5 = Descriptor::full_name_abi_cxx11_(pDVar6);
      io::Printer::Print((Printer *)pFVar1,", \"$subtype$\"\n","subtype",psVar5);
    }
    else {
      CVar4 = FieldDescriptor::cpp_type(local_28);
      pFVar1 = key_field;
      if (CVar4 == CPPTYPE_ENUM) {
        pEVar7 = FieldDescriptor::enum_type(local_28);
        psVar5 = EnumDescriptor::full_name_abi_cxx11_(pEVar7);
        io::Printer::Print((Printer *)pFVar1,", \"$subtype$\"\n","subtype",psVar5);
      }
      else {
        io::Printer::Print((Printer *)key_field,"\n");
      }
    }
  }
  else {
    LabelForField_abi_cxx11_(&local_b8,(ruby *)printer_local,field_00);
    psVar5 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)printer_local);
    io::Printer::Print((Printer *)pFVar1,"$label$ :$name$, ","label",&local_b8,"name",psVar5);
    std::__cxx11::string::~string((string *)&local_b8);
    pFVar1 = key_field;
    TypeName_abi_cxx11_(&local_d8,(ruby *)printer_local,field_03);
    uVar3 = FieldDescriptor::number((FieldDescriptor *)printer_local);
    IntToString_abi_cxx11_(&local_f8,(ruby *)(ulong)uVar3,value_00);
    io::Printer::Print((Printer *)pFVar1,":$type$, $number$","type",&local_d8,"number",&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)printer_local);
    pFVar1 = key_field;
    if (CVar4 == CPPTYPE_MESSAGE) {
      pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)printer_local);
      psVar5 = Descriptor::full_name_abi_cxx11_(pDVar6);
      io::Printer::Print((Printer *)pFVar1,", \"$subtype$\"\n","subtype",psVar5);
    }
    else {
      CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)printer_local);
      pFVar1 = key_field;
      if (CVar4 == CPPTYPE_ENUM) {
        pEVar7 = FieldDescriptor::enum_type((FieldDescriptor *)printer_local);
        psVar5 = EnumDescriptor::full_name_abi_cxx11_(pEVar7);
        io::Printer::Print((Printer *)pFVar1,", \"$subtype$\"\n","subtype",psVar5);
      }
      else {
        io::Printer::Print((Printer *)key_field,"\n");
      }
    }
  }
  return;
}

Assistant:

void GenerateField(const google::protobuf::FieldDescriptor* field,
                   google::protobuf::io::Printer* printer) {

  if (field->is_map()) {
    const FieldDescriptor* key_field =
        field->message_type()->FindFieldByNumber(1);
    const FieldDescriptor* value_field =
        field->message_type()->FindFieldByNumber(2);

    printer->Print(
      "map :$name$, :$key_type$, :$value_type$, $number$",
      "name", field->name(),
      "key_type", TypeName(key_field),
      "value_type", TypeName(value_field),
      "number", IntToString(field->number()));

    if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", value_field->message_type()->full_name());
    } else if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", value_field->enum_type()->full_name());
    } else {
      printer->Print("\n");
    }
  } else {

    printer->Print(
      "$label$ :$name$, ",
      "label", LabelForField(field),
      "name", field->name());
    printer->Print(
      ":$type$, $number$",
      "type", TypeName(field),
      "number", IntToString(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
        ", \"$subtype$\"\n",
       "subtype", field->message_type()->full_name());
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", field->enum_type()->full_name());
    } else {
      printer->Print("\n");
    }
  }
}